

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onEnterReturnStatementAstNode
          (SemanticAnalyzerRun *this,ReturnStatementAstNode *node)

{
  allocator<char> local_39;
  string local_38;
  ReturnStatementAstNode *local_18;
  ReturnStatementAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  if (this->functionDept == 0) {
    local_18 = node;
    node_local = (ReturnStatementAstNode *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Return statements can only be used from within functions.",
               &local_39);
    reportError(this,&node->returnToken,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void onEnterReturnStatementAstNode(ReturnStatementAstNode*  node) noexcept override {
    if (functionDept == 0) {
      this->reportError(node->returnToken, "Return statements can only be used from within functions.");
    }
  }